

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::pack_color_endpoints_etc
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  int *piVar1;
  uint min_new_capacity;
  uint *puVar2;
  unsigned_short *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint32 _e_1;
  vector<unsigned_int> remapped_endpoints;
  symbol_histogram hist;
  static_huffman_data_model dm;
  elemental_vector local_138;
  elemental_vector local_128;
  uint local_10c;
  vector<unsigned_char> *local_108;
  static_huffman_data_model local_100;
  symbol_codec local_c8;
  
  min_new_capacity = (this->m_color_endpoints).m_size;
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              (&local_138,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0,false);
    memset((void *)((local_138._8_8_ & 0xffffffff) * 4 + (long)local_138.m_p),0,
           (ulong)(min_new_capacity - local_138.m_size) << 2);
    local_138.m_size = min_new_capacity;
    if ((this->m_color_endpoints).m_size != 0) {
      puVar2 = (this->m_color_endpoints).m_p;
      puVar3 = remapping->m_p;
      uVar8 = 0;
      do {
        uVar7 = puVar2[uVar8];
        *(uint *)((long)local_138.m_p + (ulong)puVar3[uVar8] * 4) =
             uVar7 >> 3 & 0x1f1f1f | uVar7 & 0x7000000;
        uVar8 = uVar8 + 1;
      } while (uVar8 < (this->m_color_endpoints).m_size);
    }
  }
  local_128.m_p = (void *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  elemental_vector::increase_capacity(&local_128,0x20,false,4,(object_mover)0x0,false);
  memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
         (ulong)(0x20 - local_128.m_size) << 2);
  local_128.m_size = 0x20;
  if (local_138.m_size != 0) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar6 = *(uint *)((long)local_138.m_p + uVar8 * 4);
      iVar9 = 4;
      uVar10 = uVar6;
      do {
        piVar1 = (int *)((long)local_128.m_p + (ulong)(uVar10 - uVar7 & 0x1f) * 4);
        *piVar1 = *piVar1 + 1;
        uVar7 = uVar7 >> 8;
        uVar10 = uVar10 >> 8;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      uVar8 = uVar8 + 1;
      uVar7 = uVar6;
    } while (uVar8 < (local_138._8_8_ & 0xffffffff));
  }
  static_huffman_data_model::static_huffman_data_model(&local_100);
  static_huffman_data_model::init(&local_100,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  local_108 = packed_data;
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&local_100,false,(static_huffman_data_model *)0x0);
  if (local_138.m_size != 0) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar6 = *(uint *)((long)local_138.m_p + uVar8 * 4);
      iVar9 = 4;
      local_10c = uVar6;
      do {
        symbol_codec::encode(&local_c8,uVar6 - uVar7 & 0x1f,&local_100);
        uVar7 = uVar7 >> 8;
        uVar6 = uVar6 >> 8;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      uVar8 = uVar8 + 1;
      uVar7 = local_10c;
    } while (uVar8 < (local_138._8_8_ & 0xffffffff));
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar4 = local_108->m_p;
  local_108->m_p = local_c8.m_output_buf.m_p;
  uVar5._0_4_ = local_108->m_size;
  uVar5._4_4_ = local_108->m_capacity;
  local_108->m_size = local_c8.m_output_buf.m_size;
  local_108->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar4;
  local_c8.m_output_buf._8_8_ = uVar5;
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_100);
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  return true;
}

Assistant:

bool crn_comp::pack_color_endpoints_etc(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint32> remapped_endpoints(m_color_endpoints.size());
        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = (m_color_endpoints[i] & 0x07000000) | (m_color_endpoints[i] >> 3 & 0x001F1F1F);
        }

        symbol_histogram hist(32);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                hist.inc_freq((e - _e) & 0x1F);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                codec.encode((e - _e) & 0x1F, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }